

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ReporterRegistry::registerReporter
          (ReporterRegistry *this,string *name,IReporterFactoryPtr *factory)

{
  long lVar1;
  ReusableStringStream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_bool>
  pVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_bool>
  ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  ReusableStringStream *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  
  lVar1 = std::__cxx11::string::find(in_RSI,0x22e2f6);
  if (lVar1 != -1) {
    ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffec0);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(in_RDX,(char)((ulong)in_stack_fffffffffffffec0 >> 0x38));
    ReusableStringStream::operator<<(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffeb8);
    throw_domain_error(in_stack_fffffffffffffee0);
  }
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
            ((unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl> *)in_RDI);
  pVar2 = std::
          map<std::__cxx11::string,Catch::Detail::unique_ptr<Catch::IReporterFactory>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>>>
          ::emplace<std::__cxx11::string_const&,Catch::Detail::unique_ptr<Catch::IReporterFactory>>
                    (in_RDI,in_RDX,(unique_ptr<Catch::IReporterFactory> *)in_stack_fffffffffffffec0)
  ;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffec0);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(in_RDX,(char *)in_stack_fffffffffffffec0);
    this_00 = ReusableStringStream::operator<<(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    ReusableStringStream::str_abi_cxx11_(this_00);
    throw_domain_error(in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void ReporterRegistry::registerReporter( std::string const& name,
                                             IReporterFactoryPtr factory ) {
        CATCH_ENFORCE( name.find( "::" ) == name.npos,
                       "'::' is not allowed in reporter name: '" + name +
                           '\'' );
        auto ret = m_impl->factories.emplace( name, CATCH_MOVE( factory ) );
        CATCH_ENFORCE( ret.second,
                       "reporter using '" + name +
                           "' as name was already registered" );
    }